

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

int xmlNsCheckScope(xmlNodePtr node,xmlNsPtr ns)

{
  int iVar1;
  bool bVar2;
  xmlNsPtr oldNs;
  xmlNsPtr cur;
  xmlNsPtr ns_local;
  xmlNodePtr node_local;
  
  if ((node == (xmlNodePtr)0x0) || (ns == (xmlNsPtr)0x0)) {
    node_local._4_4_ = -1;
  }
  else {
    ns_local = (xmlNsPtr)node;
    if ((((node->type == XML_ELEMENT_NODE) || (node->type == XML_ATTRIBUTE_NODE)) ||
        (node->type == XML_DOCUMENT_NODE)) ||
       (((node->type == XML_TEXT_NODE || (node->type == XML_HTML_DOCUMENT_NODE)) ||
        (node->type == XML_XINCLUDE_START)))) {
      while( true ) {
        bVar2 = false;
        if (((ns_local != (xmlNsPtr)0x0) && (bVar2 = true, ns_local->type != XML_ELEMENT_NODE)) &&
           ((bVar2 = true, ns_local->type != XML_ATTRIBUTE_NODE &&
            (bVar2 = true, ns_local->type != XML_TEXT_NODE)))) {
          bVar2 = ns_local->type == XML_XINCLUDE_START;
        }
        if (!bVar2) break;
        if ((ns_local->type == XML_ELEMENT_NODE) || (ns_local->type == XML_XINCLUDE_START)) {
          for (oldNs = ns_local[2].next; oldNs != (xmlNsPtr)0x0; oldNs = oldNs->next) {
            if (oldNs == ns) {
              return 1;
            }
            iVar1 = xmlStrEqual(oldNs->prefix,ns->prefix);
            if (iVar1 != 0) {
              return -2;
            }
          }
        }
        ns_local = (xmlNsPtr)ns_local->context;
      }
      if ((ns_local == (xmlNsPtr)0x0) ||
         (((ns_local->type != XML_DOCUMENT_NODE && (ns_local->type != XML_HTML_DOCUMENT_NODE)) ||
          (ns_local[2].next != ns)))) {
        node_local._4_4_ = -3;
      }
      else {
        node_local._4_4_ = 1;
      }
    }
    else {
      node_local._4_4_ = -2;
    }
  }
  return node_local._4_4_;
}

Assistant:

static int
xmlNsCheckScope(xmlNodePtr node, xmlNsPtr ns)
{
    xmlNsPtr cur;

    if ((node == NULL) || (ns == NULL))
        return(-1);

    if ((node->type != XML_ELEMENT_NODE) &&
	(node->type != XML_ATTRIBUTE_NODE) &&
	(node->type != XML_DOCUMENT_NODE) &&
	(node->type != XML_TEXT_NODE) &&
	(node->type != XML_HTML_DOCUMENT_NODE) &&
	(node->type != XML_XINCLUDE_START))
	return(-2);

    while ((node != NULL) &&
           ((node->type == XML_ELEMENT_NODE) ||
            (node->type == XML_ATTRIBUTE_NODE) ||
            (node->type == XML_TEXT_NODE) ||
	    (node->type == XML_XINCLUDE_START))) {
	if ((node->type == XML_ELEMENT_NODE) ||
	    (node->type == XML_XINCLUDE_START)) {
	    cur = node->nsDef;
	    while (cur != NULL) {
	        if (cur == ns)
		    return(1);
		if (xmlStrEqual(cur->prefix, ns->prefix))
		    return(-2);
		cur = cur->next;
	    }
	}
	node = node->parent;
    }
    /* the xml namespace may be declared on the document node */
    if ((node != NULL) &&
        ((node->type == XML_DOCUMENT_NODE) ||
	 (node->type == XML_HTML_DOCUMENT_NODE))) {
	 xmlNsPtr oldNs = ((xmlDocPtr) node)->oldNs;
	 if (oldNs == ns)
	     return(1);
    }
    return(-3);
}